

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshifter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_176c39::PshifterState::update
          (PshifterState *this,ALCcontext *param_1,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  pointer paVar1;
  MixParams *mix;
  float fVar2;
  array<float,_16UL> coeffs;
  float local_70 [4];
  array<float,_16UL> local_60;
  
  mix = target.Main;
  fVar2 = exp2f((float)((props->Chorus).Waveform * 100 + (props->Chorus).Phase) / 1200.0);
  this->mPitchShiftI = (int)ROUND(fVar2 * 4096.0);
  this->mPitchShift = (double)(uint)(int)ROUND(fVar2 * 4096.0) * 0.000244140625;
  local_70[0] = 0.0;
  local_70[1] = 0.0;
  local_70[2] = -1.0;
  CalcDirectionCoeffs(&local_60,(float (*) [3])local_70,0.0);
  paVar1 = (mix->Buffer).mDataEnd;
  (this->super_EffectState).mOutTarget.mData = (mix->Buffer).mData;
  (this->super_EffectState).mOutTarget.mDataEnd = paVar1;
  ComputePanGains(mix,local_60._M_elems,slot->Gain,(span<float,_16UL>)this->mTargetGains);
  return;
}

Assistant:

void PshifterState::update(const ALCcontext*, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const int tune{props->Pshifter.CoarseTune*100 + props->Pshifter.FineTune};
    const float pitch{std::pow(2.0f, static_cast<float>(tune) / 1200.0f)};
    mPitchShiftI = fastf2u(pitch*MixerFracOne);
    mPitchShift  = mPitchShiftI * double{1.0/MixerFracOne};

    const auto coeffs = CalcDirectionCoeffs({0.0f, 0.0f, -1.0f}, 0.0f);

    mOutTarget = target.Main->Buffer;
    ComputePanGains(target.Main, coeffs.data(), slot->Gain, mTargetGains);
}